

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode header_append(Curl_easy *data,SingleRequest *k,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t local_48;
  size_t newsize;
  size_t hbufp_index;
  char *newbuff;
  size_t length_local;
  SingleRequest *k_local;
  Curl_easy *data_local;
  
  if ((data->state).headersize <= k->hbuflen + length) {
    if (0x19000 < k->hbuflen + length) {
      Curl_failf(data,"Avoided giant realloc for header (max is %d)!",0x19000);
      return CURLE_OUT_OF_MEMORY;
    }
    if ((data->state).headersize * 2 < (k->hbuflen + length) * 3 >> 1) {
      local_48 = (k->hbuflen + length) * 3 >> 1;
    }
    else {
      local_48 = (data->state).headersize << 1;
    }
    pcVar1 = k->hbufp;
    pcVar2 = (data->state).headerbuff;
    pcVar3 = (char *)(*Curl_crealloc)((data->state).headerbuff,local_48);
    if (pcVar3 == (char *)0x0) {
      Curl_failf(data,"Failed to alloc memory for big header!");
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).headersize = local_48;
    (data->state).headerbuff = pcVar3;
    k->hbufp = (data->state).headerbuff + ((long)pcVar1 - (long)pcVar2);
  }
  memcpy(k->hbufp,k->str_start,length);
  k->hbufp = k->hbufp + length;
  k->hbuflen = length + k->hbuflen;
  *k->hbufp = '\0';
  return CURLE_OK;
}

Assistant:

static CURLcode header_append(struct Curl_easy *data,
                              struct SingleRequest *k,
                              size_t length)
{
  if(k->hbuflen + length >= data->state.headersize) {
    /* We enlarge the header buffer as it is too small */
    char *newbuff;
    size_t hbufp_index;
    size_t newsize;

    if(k->hbuflen + length > CURL_MAX_HTTP_HEADER) {
      /* The reason to have a max limit for this is to avoid the risk of a bad
         server feeding libcurl with a never-ending header that will cause
         reallocs infinitely */
      failf(data, "Avoided giant realloc for header (max is %d)!",
            CURL_MAX_HTTP_HEADER);
      return CURLE_OUT_OF_MEMORY;
    }

    newsize=CURLMAX((k->hbuflen+ length)*3/2, data->state.headersize*2);
    hbufp_index = k->hbufp - data->state.headerbuff;
    newbuff = realloc(data->state.headerbuff, newsize);
    if(!newbuff) {
      failf(data, "Failed to alloc memory for big header!");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.headersize=newsize;
    data->state.headerbuff = newbuff;
    k->hbufp = data->state.headerbuff + hbufp_index;
  }
  memcpy(k->hbufp, k->str_start, length);
  k->hbufp += length;
  k->hbuflen += length;
  *k->hbufp = 0;

  return CURLE_OK;
}